

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

void __thiscall
ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo>::Append
          (ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo> *this,ON_SubDLimitMeshSealEdgeInfo *x)

{
  uchar uVar1;
  uchar uVar2;
  unsigned_short uVar3;
  int iVar4;
  ON_SubDLimitMeshSealEdgeInfo *pOVar5;
  void *temp;
  ON_SubDLimitMeshSealEdgeInfo *pOStack_20;
  int newcapacity;
  ON_SubDLimitMeshSealEdgeInfo *p;
  ON_SubDLimitMeshSealEdgeInfo *x_local;
  ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo> *this_local;
  
  pOStack_20 = x;
  if (this->m_count == this->m_capacity) {
    iVar4 = NewCapacity(this);
    if ((this->m_a <= x) && (x < this->m_a + this->m_capacity)) {
      pOStack_20 = (ON_SubDLimitMeshSealEdgeInfo *)onmalloc(0x10);
      uVar1 = x->m_bits;
      uVar2 = x->m_grid_side_dex;
      uVar3 = x->m_face_edge_count;
      pOStack_20->m_edge_id = x->m_edge_id;
      pOStack_20->m_bits = uVar1;
      pOStack_20->m_grid_side_dex = uVar2;
      pOStack_20->m_face_edge_count = uVar3;
      pOStack_20->m_fragment = x->m_fragment;
    }
    Reserve(this,(long)iVar4);
    if (this->m_a == (ON_SubDLimitMeshSealEdgeInfo *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  iVar4 = this->m_count;
  this->m_count = iVar4 + 1;
  pOVar5 = this->m_a + iVar4;
  uVar1 = pOStack_20->m_bits;
  uVar2 = pOStack_20->m_grid_side_dex;
  uVar3 = pOStack_20->m_face_edge_count;
  pOVar5->m_edge_id = pOStack_20->m_edge_id;
  pOVar5->m_bits = uVar1;
  pOVar5->m_grid_side_dex = uVar2;
  pOVar5->m_face_edge_count = uVar3;
  pOVar5->m_fragment = pOStack_20->m_fragment;
  if (pOStack_20 != x) {
    onfree(pOStack_20);
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}